

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86.cpp
# Opt level: O3

int __thiscall ncnn::TanH_x86::forward_inplace(TanH_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  float *pfVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  float fVar9;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  auVar2 = _DAT_003144d0;
  auVar12 = _DAT_003144c0;
  uVar1 = bottom_top_blob->c;
  uVar7 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        if (0 < (int)uVar7) {
          pfVar5 = (float *)(bottom_top_blob->cstep * uVar4 * bottom_top_blob->elemsize +
                            (long)bottom_top_blob->data);
          uVar6 = uVar7;
          do {
            auVar17._0_4_ = *pfVar5 * -2.0;
            auVar17._4_4_ = pfVar5[1] * -2.0;
            auVar17._8_4_ = pfVar5[2] * -2.0;
            auVar17._12_4_ = pfVar5[3] * -2.0;
            auVar18 = minps(auVar17,auVar12);
            auVar18 = maxps(auVar18,auVar2);
            fVar9 = auVar18._0_4_ * 1.442695 + 0.5;
            fVar14 = auVar18._4_4_ * 1.442695 + 0.5;
            fVar15 = auVar18._8_4_ * 1.442695 + 0.5;
            fVar16 = auVar18._12_4_ * 1.442695 + 0.5;
            fVar22 = (float)(int)fVar9;
            fVar23 = (float)(int)fVar14;
            fVar24 = (float)(int)fVar15;
            fVar25 = (float)(int)fVar16;
            fVar22 = fVar22 - (float)(-(uint)(fVar9 < fVar22) & 0x3f800000);
            fVar23 = fVar23 - (float)(-(uint)(fVar14 < fVar23) & 0x3f800000);
            fVar24 = fVar24 - (float)(-(uint)(fVar15 < fVar24) & 0x3f800000);
            fVar25 = fVar25 - (float)(-(uint)(fVar16 < fVar25) & 0x3f800000);
            fVar9 = fVar22 * -0.6931472 + auVar18._0_4_;
            fVar14 = fVar23 * -0.6931472 + auVar18._4_4_;
            fVar15 = fVar24 * -0.6931472 + auVar18._8_4_;
            fVar16 = fVar25 * -0.6931472 + auVar18._12_4_;
            auVar19._0_4_ = fVar9 * fVar9;
            auVar19._4_4_ = fVar14 * fVar14;
            auVar19._8_4_ = fVar15 * fVar15;
            auVar19._12_4_ = fVar16 * fVar16;
            auVar10._0_4_ =
                 (float)((int)fVar22 * 0x800000 + 0x3f800000) *
                 (fVar9 + 1.0 +
                 (((((fVar9 * 0.00019875691 + 0.0013981999) * fVar9 + 0.008333452) * fVar9 +
                   0.041665796) * fVar9 + 0.16666666) * fVar9 + 0.5) * auVar19._0_4_) + 1.0;
            auVar10._4_4_ =
                 (float)((int)fVar23 * 0x800000 + 0x3f800000) *
                 (fVar14 + 1.0 +
                 (((((fVar14 * 0.00019875691 + 0.0013981999) * fVar14 + 0.008333452) * fVar14 +
                   0.041665796) * fVar14 + 0.16666666) * fVar14 + 0.5) * auVar19._4_4_) + 1.0;
            auVar10._8_4_ =
                 (float)((int)fVar24 * 0x800000 + 0x3f800000) *
                 (fVar15 + 1.0 +
                 (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
                   0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5) * auVar19._8_4_) + 1.0;
            auVar10._12_4_ =
                 (float)((int)fVar25 * 0x800000 + 0x3f800000) *
                 (fVar16 + 1.0 +
                 (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
                   0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5) * auVar19._12_4_) + 1.0;
            auVar18 = rcpps(auVar19,auVar10);
            fVar9 = auVar18._0_4_;
            fVar14 = auVar18._4_4_;
            fVar15 = auVar18._8_4_;
            fVar16 = auVar18._12_4_;
            *pfVar5 = (2.0 - auVar10._0_4_ * (fVar9 + fVar9)) * fVar9 + fVar9 + fVar9 + -1.0;
            pfVar5[1] = (2.0 - auVar10._4_4_ * (fVar14 + fVar14)) * fVar14 + fVar14 + fVar14 + -1.0;
            pfVar5[2] = (2.0 - auVar10._8_4_ * (fVar15 + fVar15)) * fVar15 + fVar15 + fVar15 + -1.0;
            pfVar5[3] = (2.0 - auVar10._12_4_ * (fVar16 + fVar16)) * fVar16 + fVar16 + fVar16 + -1.0
            ;
            pfVar5 = pfVar5 + 4;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar1);
    }
  }
  else if (0 < (int)uVar1) {
    uVar4 = 0;
    do {
      pfVar5 = (float *)(bottom_top_blob->cstep * uVar4 * bottom_top_blob->elemsize +
                        (long)bottom_top_blob->data);
      if ((int)uVar7 < 4) {
        uVar6 = 0;
      }
      else {
        iVar3 = 3;
        do {
          auVar11._0_4_ = *pfVar5 * -2.0;
          auVar11._4_4_ = pfVar5[1] * -2.0;
          auVar11._8_4_ = pfVar5[2] * -2.0;
          auVar11._12_4_ = pfVar5[3] * -2.0;
          auVar2._8_4_ = 0x42b0c0a5;
          auVar2._0_8_ = 0x42b0c0a542b0c0a5;
          auVar2._12_4_ = 0x42b0c0a5;
          auVar12 = minps(auVar11,auVar2);
          auVar18._8_4_ = 0xc2b0c0a5;
          auVar18._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar18._12_4_ = 0xc2b0c0a5;
          auVar12 = maxps(auVar12,auVar18);
          fVar14 = auVar12._0_4_ * 1.442695 + 0.5;
          fVar16 = auVar12._4_4_ * 1.442695 + 0.5;
          fVar23 = auVar12._8_4_ * 1.442695 + 0.5;
          fVar25 = auVar12._12_4_ * 1.442695 + 0.5;
          fVar9 = (float)(int)fVar14;
          fVar15 = (float)(int)fVar16;
          fVar22 = (float)(int)fVar23;
          fVar24 = (float)(int)fVar25;
          fVar9 = fVar9 - (float)(-(uint)(fVar14 < fVar9) & 0x3f800000);
          fVar15 = fVar15 - (float)(-(uint)(fVar16 < fVar15) & 0x3f800000);
          fVar22 = fVar22 - (float)(-(uint)(fVar23 < fVar22) & 0x3f800000);
          fVar24 = fVar24 - (float)(-(uint)(fVar25 < fVar24) & 0x3f800000);
          fVar14 = fVar9 * -0.6931472 + auVar12._0_4_;
          fVar16 = fVar15 * -0.6931472 + auVar12._4_4_;
          fVar23 = fVar22 * -0.6931472 + auVar12._8_4_;
          fVar25 = fVar24 * -0.6931472 + auVar12._12_4_;
          auVar13._0_4_ = fVar14 * fVar14;
          auVar13._4_4_ = fVar16 * fVar16;
          auVar13._8_4_ = fVar23 * fVar23;
          auVar13._12_4_ = fVar25 * fVar25;
          fVar20 = (float)((int)fVar9 * 0x800000 + 0x3f800000) *
                   (fVar14 + 1.0 +
                   (((((fVar14 * 0.00019875691 + 0.0013981999) * fVar14 + 0.008333452) * fVar14 +
                     0.041665796) * fVar14 + 0.16666666) * fVar14 + 0.5) * auVar13._0_4_) + 1.0;
          fVar21 = (float)((int)fVar15 * 0x800000 + 0x3f800000) *
                   (fVar16 + 1.0 +
                   (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
                     0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5) * auVar13._4_4_) + 1.0;
          fVar22 = (float)((int)fVar22 * 0x800000 + 0x3f800000) *
                   (fVar23 + 1.0 +
                   (((((fVar23 * 0.00019875691 + 0.0013981999) * fVar23 + 0.008333452) * fVar23 +
                     0.041665796) * fVar23 + 0.16666666) * fVar23 + 0.5) * auVar13._8_4_) + 1.0;
          fVar23 = (float)((int)fVar24 * 0x800000 + 0x3f800000) *
                   (fVar25 + 1.0 +
                   (((((fVar25 * 0.00019875691 + 0.0013981999) * fVar25 + 0.008333452) * fVar25 +
                     0.041665796) * fVar25 + 0.16666666) * fVar25 + 0.5) * auVar13._12_4_) + 1.0;
          auVar12._4_4_ = fVar21;
          auVar12._0_4_ = fVar20;
          auVar12._8_4_ = fVar22;
          auVar12._12_4_ = fVar23;
          auVar12 = rcpps(auVar13,auVar12);
          fVar9 = auVar12._0_4_;
          fVar14 = auVar12._4_4_;
          fVar15 = auVar12._8_4_;
          fVar16 = auVar12._12_4_;
          *pfVar5 = (2.0 - fVar20 * (fVar9 + fVar9)) * fVar9 + fVar9 + fVar9 + -1.0;
          pfVar5[1] = (2.0 - fVar21 * (fVar14 + fVar14)) * fVar14 + fVar14 + fVar14 + -1.0;
          pfVar5[2] = (2.0 - fVar22 * (fVar15 + fVar15)) * fVar15 + fVar15 + fVar15 + -1.0;
          pfVar5[3] = (2.0 - fVar23 * (fVar16 + fVar16)) * fVar16 + fVar16 + fVar16 + -1.0;
          pfVar5 = pfVar5 + 4;
          iVar3 = iVar3 + 4;
          uVar6 = uVar7 & 0xfffffffc;
        } while (iVar3 < (int)uVar7);
      }
      if (uVar7 - uVar6 != 0 && (int)uVar6 <= (int)uVar7) {
        lVar8 = 0;
        do {
          fVar9 = tanhf(pfVar5[lVar8]);
          pfVar5[lVar8] = fVar9;
          lVar8 = lVar8 + 1;
        } while (uVar7 - uVar6 != (int)lVar8);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar1);
  }
  return 0;
}

Assistant:

int TanH_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = tanh_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = tanh_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanh(*ptr);
            ptr++;
        }
    }

    return 0;
}